

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfdriver.c
# Opt level: O3

char * sfnt_get_ps_name(TT_Face face)

{
  byte *pbVar1;
  char cVar2;
  FT_UInt FVar3;
  FT_Memory pFVar4;
  TT_NameRec *pTVar5;
  FT_Stream pFVar6;
  void *pvVar7;
  FT_Memory memory;
  FT_Bool FVar8;
  uint uVar9;
  char *pcVar10;
  size_t sVar11;
  char *pcVar12;
  uint *puVar13;
  uint uVar14;
  undefined8 uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  byte *pbVar20;
  int *piVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  byte *pbVar25;
  char *pcVar26;
  uint uVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  bool bVar32;
  FT_Int apple_1;
  FT_Int win_1;
  FT_UInt num_coords;
  FT_Int apple;
  FT_MM_Var *mm_var;
  FT_Error error;
  FT_Int win;
  int local_6c;
  int local_68;
  uint local_64;
  uint *local_60;
  long local_58;
  int local_4c;
  undefined8 local_48;
  int local_40;
  uint local_3c;
  char *local_38;
  
  if (face->postscript_name != (char *)0x0) {
    return face->postscript_name;
  }
  if ((face->blend == (GX_Blend)0x0) ||
     ((((face->root).face_index & 0x7fff0000) == 0 && (((face->root).face_flags & 0x8000) == 0)))) {
    FVar8 = sfnt_get_name_id(face,6,(FT_Int *)&local_48,(FT_Int *)&local_60);
    if (FVar8 == '\0') {
      return (char *)0x0;
    }
    pFVar4 = (face->root).memory;
    pTVar5 = (face->name_table).names;
    pFVar6 = (face->name_table).stream;
    if ((long)(int)local_48 == -1) {
      pcVar10 = get_apple_string(pFVar4,pFVar6,pTVar5 + (int)local_60,sfnt_is_postscript,'\x01');
    }
    else {
      pcVar10 = get_win_string(pFVar4,pFVar6,pTVar5 + (int)local_48,sfnt_is_postscript,'\x01');
    }
    goto LAB_00163a78;
  }
  pFVar4 = (face->root).memory;
  pvVar7 = face->mm;
  if (face->var_postscript_prefix == (char *)0x0) {
    FVar8 = sfnt_get_name_id(face,0x19,&local_68,&local_6c);
    if (((FVar8 != '\0') || (FVar8 = sfnt_get_name_id(face,0x10,&local_68,&local_6c), FVar8 != '\0')
        ) || (FVar8 = sfnt_get_name_id(face,1,&local_68,&local_6c), FVar8 != '\0')) {
      memory = (face->root).memory;
      pTVar5 = (face->name_table).names;
      pFVar6 = (face->name_table).stream;
      if ((long)local_68 == -1) {
        pcVar10 = get_apple_string(memory,pFVar6,pTVar5 + local_6c,sfnt_is_alphanumeric,'\0');
      }
      else {
        pcVar10 = get_win_string(memory,pFVar6,pTVar5 + local_68,sfnt_is_alphanumeric,'\0');
      }
      sVar11 = strlen(pcVar10);
      uVar9 = (uint)sVar11;
      if (0x5b < uVar9) {
        pcVar10[0x5b] = '\0';
        uVar9 = 0x5b;
      }
      face->var_postscript_prefix = pcVar10;
      face->var_postscript_prefix_len = uVar9;
      goto LAB_0016323f;
    }
LAB_00163402:
    pcVar10 = (char *)0x0;
  }
  else {
LAB_0016323f:
    (**(code **)((long)pvVar7 + 0x40))(face,&local_64,&local_60,0,&local_58);
    uVar23 = (face->root).face_index & 0x7fff0000;
    if ((uVar23 == 0) || (((face->root).face_flags & 0x8000) != 0)) {
LAB_001633cc:
      lVar16 = *(long *)(local_58 + 0x10);
      pcVar10 = (char *)ft_mem_alloc(pFVar4,(ulong)(face->var_postscript_prefix_len +
                                                    local_64 * 0x11 + 1),&local_4c);
      if (local_4c != 0) goto LAB_00163402;
      strcpy(pcVar10,face->var_postscript_prefix);
      pbVar25 = (byte *)(pcVar10 + face->var_postscript_prefix_len);
      if (local_64 != 0) {
        uVar9 = 0;
        pbVar20 = pbVar25;
        do {
          pbVar25 = pbVar20;
          if (*(long *)local_60 != *(long *)(lVar16 + 0x10)) {
            pbVar25 = pbVar20 + 1;
            *pbVar20 = 0x5f;
            uVar14 = *local_60;
            if (uVar14 == 0) {
              pbVar20[1] = 0x30;
              pbVar25 = pbVar20 + 2;
            }
            else {
              if ((int)uVar14 < 0) {
                pbVar20[1] = 0x2d;
                pbVar25 = pbVar20 + 2;
                uVar14 = -uVar14;
              }
              if (0xffff < uVar14) {
                uVar27 = uVar14 >> 0x10;
                pbVar20 = (byte *)&local_48;
                do {
                  *pbVar20 = (char)uVar27 + (char)(uVar27 / 10) * -10 | 0x30;
                  pbVar20 = pbVar20 + 1;
                  bVar32 = 9 < uVar27;
                  uVar27 = uVar27 / 10;
                } while (bVar32);
                for (; &local_48 < pbVar20; pbVar20 = pbVar20 + -1) {
                  *pbVar25 = pbVar20[-1];
                  pbVar25 = pbVar25 + 1;
                }
              }
              if ((uVar14 & 0xffff) != 0) {
                *pbVar25 = 0x2e;
                lVar24 = 0;
                uVar14 = (uVar14 & 0xffff) * 10 + 5;
                do {
                  uVar27 = uVar14;
                  lVar31 = lVar24;
                  cVar2 = (char)(uVar27 >> 0x10);
                  bVar17 = cVar2 + 0x30;
                  pbVar25[lVar31 + 1] = bVar17;
                  uVar22 = uVar27 & 0xffff;
                  if (uVar22 == 0) {
                    if (lVar31 != 4) goto LAB_00163579;
                    if (bVar17 != 0x31) goto LAB_00163564;
                    goto LAB_0016355b;
                  }
                  lVar24 = lVar31 + 1;
                  uVar14 = uVar22 * 10;
                } while ((int)lVar24 != 5);
                if ((lVar24 == 5) && (uVar22 < 0x86b0)) {
                  if (bVar17 != 0x31) {
                    if (uVar22 == 0x4350) {
                      if ((uVar27 >> 0x10 & 1) != 0) {
LAB_0016356d:
                        bVar17 = cVar2 + 0x2f;
                        pbVar25[lVar31 + 1] = bVar17;
                      }
                    }
                    else if (uVar22 < 0x4350) {
LAB_00163564:
                      if (0xffff < uVar27) goto LAB_0016356d;
                      goto LAB_0016357f;
                    }
                    goto LAB_00163579;
                  }
LAB_0016355b:
                  pbVar25[lVar31 + 1] = 0x30;
LAB_0016357f:
                  pbVar20 = pbVar25 + lVar31 + 1;
                  do {
                    pbVar25 = pbVar20 + -1;
                    *pbVar20 = 0;
                    pbVar1 = pbVar20 + -1;
                    pbVar20 = pbVar25;
                  } while (*pbVar1 == 0x30);
                }
                else {
LAB_00163579:
                  if (bVar17 == 0x30) goto LAB_0016357f;
                  pbVar25 = pbVar25 + lVar31 + 1;
                }
                pbVar25 = pbVar25 + 1;
              }
            }
            uVar15 = *(undefined8 *)(lVar16 + 0x20);
            if (((uint)((ulong)uVar15 >> 0x18) & 0xff) != 0x20) {
              bVar17 = (byte)((ulong)uVar15 >> 0x18);
              iVar28 = (int)(char)bVar17;
              if (iVar28 - 0x61U < 0x1a || (iVar28 - 0x41U < 0x1a || iVar28 - 0x30U < 10)) {
                *pbVar25 = bVar17;
                pbVar25 = pbVar25 + 1;
                uVar15 = *(undefined8 *)(lVar16 + 0x20);
              }
            }
            bVar17 = (byte)((ulong)uVar15 >> 0x10);
            if ((bVar17 != 0x20) &&
               (iVar28 = (int)(char)bVar17,
               iVar28 - 0x61U < 0x1a || (iVar28 - 0x41U < 0x1a || iVar28 - 0x30U < 10))) {
              *pbVar25 = bVar17;
              pbVar25 = pbVar25 + 1;
              uVar15 = *(undefined8 *)(lVar16 + 0x20);
            }
            bVar17 = (byte)((ulong)uVar15 >> 8);
            if ((bVar17 != 0x20) &&
               (iVar28 = (int)(char)bVar17,
               iVar28 - 0x61U < 0x1a || (iVar28 - 0x41U < 0x1a || iVar28 - 0x30U < 10))) {
              *pbVar25 = bVar17;
              pbVar25 = pbVar25 + 1;
              uVar15 = *(undefined8 *)(lVar16 + 0x20);
            }
            bVar17 = (byte)uVar15;
            if ((bVar17 != 0x20) &&
               (iVar28 = (int)(char)bVar17,
               iVar28 - 0x61U < 0x1a || (iVar28 - 0x41U < 0x1a || iVar28 - 0x30U < 10))) {
              *pbVar25 = bVar17;
              pbVar25 = pbVar25 + 1;
            }
          }
          uVar9 = uVar9 + 1;
          local_60 = local_60 + 2;
          lVar16 = lVar16 + 0x30;
          pbVar20 = pbVar25;
        } while (uVar9 < local_64);
      }
    }
    else {
      pvVar7 = face->sfnt;
      lVar16 = *(long *)(local_58 + 0x18);
      lVar24 = ((uVar23 >> 0x10) - 1) * 0x10;
      iVar28 = *(int *)(lVar16 + 0xc + lVar24);
      local_48 = (char *)0x0;
      if (iVar28 == 6 || iVar28 - 0x100U < 0x7f00) {
        (**(code **)((long)pvVar7 + 0xe8))(face,(short)iVar28,&local_48);
        pcVar10 = local_48;
        if (local_48 == (char *)0x0) {
          lVar16 = *(long *)(local_58 + 0x18);
          goto LAB_001632f0;
        }
        sVar11 = strlen(local_48);
        pbVar25 = (byte *)(pcVar10 + sVar11 + 1);
      }
      else {
LAB_001632f0:
        (**(code **)((long)pvVar7 + 0xe8))(face,*(undefined2 *)(lVar16 + 8 + lVar24),&local_38);
        if (local_38 == (char *)0x0) goto LAB_001633cc;
        FVar3 = face->var_postscript_prefix_len;
        sVar11 = strlen(local_38);
        pcVar10 = (char *)ft_mem_alloc(pFVar4,sVar11 + (FVar3 + 1) + 1,&local_4c);
        if (local_4c != 0) goto LAB_00163402;
        strcpy(pcVar10,face->var_postscript_prefix);
        pcVar26 = pcVar10 + (ulong)face->var_postscript_prefix_len + 1;
        pcVar10[face->var_postscript_prefix_len] = '-';
        cVar2 = *local_38;
        pcVar12 = local_38;
        while (cVar2 != '\0') {
          pcVar12 = pcVar12 + 1;
          iVar28 = (int)cVar2;
          if (iVar28 - 0x61U < 0x1a || (iVar28 - 0x41U < 0x1a || iVar28 - 0x30U < 10)) {
            *pcVar26 = cVar2;
            pcVar26 = pcVar26 + 1;
          }
          cVar2 = *pcVar12;
        }
        *pcVar26 = '\0';
        pbVar25 = (byte *)(pcVar26 + 1);
        ft_mem_free(pFVar4,local_38);
      }
    }
    if (0x7f < (long)pbVar25 - (long)pcVar10) {
      uVar9 = (uint)((long)pbVar25 - (long)pcVar10);
      uVar14 = uVar9;
      if ((int)uVar9 < 0) {
        uVar14 = uVar9 + 0xf;
      }
      lVar16 = (long)(int)(uVar14 & 0xfffffff0);
      uVar22 = 0x75bcd15;
      uVar30 = 0x75bcd15;
      uVar29 = 0x75bcd15;
      uVar27 = 0x75bcd15;
      if (0x1e < uVar9 + 0xf) {
        lVar24 = (long)((int)uVar14 >> 4);
        piVar21 = (int *)(pcVar10 + lVar16 + lVar24 * -0x10 + 0xc);
        uVar29 = 0x75bcd15;
        uVar30 = 0x75bcd15;
        uVar22 = 0x75bcd15;
        do {
          uVar27 = ((uint)(piVar21[-3] * 0x239b961b) >> 0x11 | piVar21[-3] * -0x34f28000) *
                   -0x54f16877 ^ uVar27;
          iVar28 = (uVar27 << 0x13 | uVar27 >> 0xd) + uVar29;
          uVar27 = iVar28 * 5 + 0x561ccd1b;
          uVar29 = ((uint)(piVar21[-2] * -0x54f16877) >> 0x10 | piVar21[-2] * -0x68770000) *
                   0x38b34ae5 ^ uVar29;
          uVar29 = ((uVar29 << 0x11 | uVar29 >> 0xf) + uVar30) * 5 + 0xbcaa747;
          uVar30 = ((uint)(piVar21[-1] * 0x38b34ae5) >> 0xf | piVar21[-1] * -0x6a360000) *
                   -0x5e1c746d ^ uVar30;
          uVar30 = ((uVar30 << 0xf | uVar30 >> 0x11) + uVar22) * 5 + 0x96cd1c35;
          uVar22 = ((uint)(*piVar21 * -0x5e1c746d) >> 0xe | *piVar21 * 0x2e4c0000) * 0x239b961b ^
                   uVar22;
          uVar22 = ((uVar22 << 0xd | uVar22 >> 0x13) + iVar28 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
          piVar21 = piVar21 + 4;
          lVar24 = lVar24 + -1;
        } while (lVar24 != 0);
      }
      uVar18 = 0;
      uVar14 = 0;
      switch(uVar9 & 0xf) {
      case 0xf:
        uVar14 = (uint)(byte)pcVar10[lVar16 + 0xe] << 0x10;
      case 0xe:
        uVar14 = uVar14 | (uint)(byte)pcVar10[lVar16 + 0xd] << 8;
      case 0xd:
        uVar22 = uVar22 ^ (((byte)pcVar10[lVar16 + 0xc] ^ uVar14) * -0x5e1c746d >> 0xe |
                          ((byte)pcVar10[lVar16 + 0xc] ^ uVar14) * 0x2e4c0000) * 0x239b961b;
      case 0xc:
        uVar14 = (uint)(byte)pcVar10[lVar16 + 0xb] << 0x18;
      case 0xb:
        uVar14 = uVar14 | (uint)(byte)pcVar10[lVar16 + 10] << 0x10;
      case 10:
        uVar14 = uVar14 ^ (uint)(byte)pcVar10[lVar16 + 9] << 8;
      case 9:
        uVar30 = uVar30 ^ (((byte)pcVar10[lVar16 + 8] ^ uVar14) * 0x38b34ae5 >> 0xf |
                          ((byte)pcVar10[lVar16 + 8] ^ uVar14) * -0x6a360000) * -0x5e1c746d;
      case 8:
        uVar14 = (uint)(byte)pcVar10[lVar16 + 7] << 0x18;
      case 7:
        uVar14 = uVar14 | (uint)(byte)pcVar10[lVar16 + 6] << 0x10;
      case 6:
        uVar14 = uVar14 ^ (uint)(byte)pcVar10[lVar16 + 5] << 8;
      case 5:
        uVar29 = uVar29 ^ (((byte)pcVar10[lVar16 + 4] ^ uVar14) * -0x54f16877 >> 0x10 |
                          ((byte)pcVar10[lVar16 + 4] ^ uVar14) * -0x68770000) * 0x38b34ae5;
      case 4:
        uVar14 = (uint)(byte)pcVar10[lVar16 + 3] << 0x18;
      case 3:
        uVar18 = uVar14 | (uint)(byte)pcVar10[lVar16 + 2] << 0x10;
      case 2:
        uVar18 = uVar18 ^ (uint)(byte)pcVar10[lVar16 + 1] << 8;
      case 1:
        uVar27 = uVar27 ^ (((byte)pcVar10[lVar16] ^ uVar18) * 0x239b961b >> 0x11 |
                          ((byte)pcVar10[lVar16] ^ uVar18) * -0x34f28000) * -0x54f16877;
      case 0:
        uVar18 = (uVar27 ^ uVar9) + (uVar30 ^ uVar9) + (uVar29 ^ uVar9) + (uVar22 ^ uVar9);
        uVar27 = (uVar29 ^ uVar9) + uVar18;
        uVar14 = (uVar30 ^ uVar9) + uVar18;
        uVar9 = (uVar22 ^ uVar9) + uVar18;
        uVar22 = (uVar18 >> 0x10 ^ uVar18) * -0x7a143595;
        uVar22 = (uVar22 >> 0xd ^ uVar22) * -0x3d4d51cb;
        uVar27 = (uVar27 >> 0x10 ^ uVar27) * -0x7a143595;
        uVar27 = (uVar27 >> 0xd ^ uVar27) * -0x3d4d51cb;
        uVar27 = uVar27 >> 0x10 ^ uVar27;
        uVar14 = (uVar14 >> 0x10 ^ uVar14) * -0x7a143595;
        uVar14 = (uVar14 >> 0xd ^ uVar14) * -0x3d4d51cb;
        uVar14 = uVar14 >> 0x10 ^ uVar14;
        uVar9 = (uVar9 >> 0x10 ^ uVar9) * -0x7a143595;
        uVar9 = (uVar9 >> 0xd ^ uVar9) * -0x3d4d51cb;
        uVar9 = uVar9 >> 0x10 ^ uVar9;
        iVar28 = (uVar22 >> 0x10 ^ uVar22) + uVar27 + uVar14 + uVar9;
        puVar13 = &local_3c;
        local_48 = (char *)CONCAT44(uVar27 + iVar28,iVar28);
        local_40 = uVar14 + iVar28;
        local_3c = uVar9 + iVar28;
        pcVar26 = pcVar10 + face->var_postscript_prefix_len;
        pcVar12 = pcVar26 + 0x20;
        *pcVar26 = '-';
        pcVar26[0x21] = '.';
        pcVar26[0x22] = '.';
        pcVar26[0x23] = '.';
        pcVar26[0x24] = '\0';
        iVar28 = 0;
        do {
          uVar9 = *puVar13;
          iVar19 = 8;
          do {
            *pcVar12 = "0123456789ABCDEF"[uVar9 & 0xf];
            pcVar12 = pcVar12 + -1;
            uVar9 = uVar9 >> 4;
            iVar19 = iVar19 + -1;
          } while (iVar19 != 0);
          iVar28 = iVar28 + 1;
          puVar13 = puVar13 + -1;
        } while (iVar28 != 4);
      }
    }
  }
LAB_00163a78:
  face->postscript_name = pcVar10;
  return pcVar10;
}

Assistant:

static const char*
  sfnt_get_ps_name( TT_Face  face )
  {
    FT_Int       found, win, apple;
    const char*  result = NULL;


    if ( face->postscript_name )
      return face->postscript_name;

#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
    if ( face->blend                                 &&
         ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) ||
           FT_IS_VARIATION( FT_FACE( face ) )      ) )
    {
      face->postscript_name = sfnt_get_var_ps_name( face );
      return face->postscript_name;
    }
#endif

    /* scan the name table to see whether we have a Postscript name here, */
    /* either in Macintosh or Windows platform encodings                  */
    found = sfnt_get_name_id( face, TT_NAME_ID_PS_NAME, &win, &apple );
    if ( !found )
      return NULL;

    /* prefer Windows entries over Apple */
    if ( win != -1 )
      result = get_win_string( face->root.memory,
                               face->name_table.stream,
                               face->name_table.names + win,
                               sfnt_is_postscript,
                               1 );
    else
      result = get_apple_string( face->root.memory,
                                 face->name_table.stream,
                                 face->name_table.names + apple,
                                 sfnt_is_postscript,
                                 1 );

    face->postscript_name = result;

    return result;
  }